

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O3

void text_reporter_print_results
               (char *buf,char *prepend,int passes,int failures,int skips,int exceptions,
               uint32_t duration,_Bool use_colors)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 *__src;
  
  __sprintf_chk(buf,1,0xffffffffffffffff,"%s",prepend);
  if (((failures == 0 && passes == 0) && skips == 0) && exceptions == 0) {
    __src = "No assertions";
  }
  else {
    if (passes != 0) {
      pcVar2 = "\x1b[0m";
      if (!use_colors) {
        pcVar2 = "";
      }
      pcVar1 = "\x1b[32m";
      if (!use_colors) {
        pcVar1 = "";
      }
      if (passes < 1) {
        pcVar1 = "";
      }
      pcVar3 = "es";
      if (passes == 1) {
        pcVar3 = "";
      }
      __sprintf_chk(format_passes_buff,1,100,"%s%d %s%s%s",pcVar1,passes,"pass",pcVar3,pcVar2);
      strcat(buf,format_passes_buff);
    }
    if (skips != 0) {
      insert_comma(buf);
      pcVar2 = "\x1b[0m";
      if (!use_colors) {
        pcVar2 = "";
      }
      pcVar1 = "\x1b[33m";
      if (!use_colors) {
        pcVar1 = "";
      }
      if (skips < 1) {
        pcVar1 = "";
      }
      __sprintf_chk(format_skips_buff,1,100,"%s%d %s%s%s",pcVar1,skips,"skipped","",pcVar2);
      strcat(buf,format_skips_buff);
    }
    if (failures != 0) {
      insert_comma(buf);
      pcVar2 = "\x1b[0m";
      if (!use_colors) {
        pcVar2 = "";
      }
      pcVar1 = "\x1b[31m";
      if (!use_colors) {
        pcVar1 = "";
      }
      if (failures < 1) {
        pcVar1 = "";
      }
      pcVar3 = "s";
      if (failures == 1) {
        pcVar3 = "";
      }
      __sprintf_chk(format_failures_buff,1,100,"%s%d %s%s%s",pcVar1,failures,"failure",pcVar3,pcVar2
                   );
      strcat(buf,format_failures_buff);
    }
    if (exceptions != 0) {
      insert_comma(buf);
      pcVar2 = "\x1b[0m";
      if (!use_colors) {
        pcVar2 = "";
      }
      pcVar1 = "\x1b[35m";
      if (!use_colors) {
        pcVar1 = "";
      }
      if (exceptions < 1) {
        pcVar1 = "";
      }
      pcVar3 = "s";
      if (exceptions == 1) {
        pcVar3 = "";
      }
      __sprintf_chk(format_exceptions_buff,1,100,"%s%d %s%s%s",pcVar1,exceptions,"exception",pcVar3,
                    pcVar2);
      strcat(buf,format_exceptions_buff);
    }
    __src = format_duration_buff;
    __snprintf_chk(format_duration_buff,100,1,100," in %dms",duration);
  }
  strcat(buf,__src);
  return;
}

Assistant:

static void text_reporter_print_results(char *buf, char *prepend,
    int passes, int failures, int skips, int exceptions, uint32_t duration,
    bool use_colors) {

    sprintf(buf, "%s", prepend);
    if (passes || failures || skips || exceptions) {
        if (passes)
            strcat(buf, format_passes(passes, use_colors));
        if (skips) {
            insert_comma(buf);
            strcat(buf, format_skips(skips, use_colors));
        }
        if (failures) {
            insert_comma(buf);
            strcat(buf, format_failures(failures, use_colors));
        }
        if (exceptions) {
            insert_comma(buf);
            strcat(buf, format_exceptions(exceptions, use_colors));
        }
        strcat(buf, format_duration(duration));
    } else {
        strcat(buf, "No assertions");
    }
}